

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorKey(BtCursor *pCur)

{
  u32 uVar1;
  i64 iVar2;
  void *pBuf;
  void *pKey;
  int rc;
  BtCursor *pCur_local;
  
  pKey._4_4_ = 0;
  if (pCur->curIntKey == '\0') {
    uVar1 = sqlite3BtreePayloadSize(pCur);
    pCur->nKey = (ulong)uVar1;
    pBuf = sqlite3Malloc(pCur->nKey + 0x11);
    if (pBuf == (void *)0x0) {
      pKey._4_4_ = 7;
    }
    else {
      pKey._4_4_ = sqlite3BtreePayload(pCur,0,(u32)pCur->nKey,pBuf);
      if (pKey._4_4_ == 0) {
        memset((void *)((long)pBuf + pCur->nKey),0,0x11);
        pCur->pKey = pBuf;
      }
      else {
        sqlite3_free(pBuf);
      }
    }
  }
  else {
    iVar2 = sqlite3BtreeIntegerKey(pCur);
    pCur->nKey = iVar2;
  }
  return pKey._4_4_;
}

Assistant:

static int saveCursorKey(BtCursor *pCur){
  int rc = SQLITE_OK;
  assert( CURSOR_VALID==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curIntKey ){
    /* Only the rowid is required for a table btree */
    pCur->nKey = sqlite3BtreeIntegerKey(pCur);
  }else{
    /* For an index btree, save the complete key content. It is possible
    ** that the current key is corrupt. In that case, it is possible that
    ** the sqlite3VdbeRecordUnpack() function may overread the buffer by
    ** up to the size of 1 varint plus 1 8-byte value when the cursor 
    ** position is restored. Hence the 17 bytes of padding allocated 
    ** below. */
    void *pKey;
    pCur->nKey = sqlite3BtreePayloadSize(pCur);
    pKey = sqlite3Malloc( pCur->nKey + 9 + 8 );
    if( pKey ){
      rc = sqlite3BtreePayload(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        memset(((u8*)pKey)+pCur->nKey, 0, 9+8);
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  assert( !pCur->curIntKey || !pCur->pKey );
  return rc;
}